

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O0

bool backward_pawn<(Color)0>(int *row,int *col,U64 *pawns)

{
  int iVar1;
  bool bVar2;
  byte local_5c;
  byte local_5b;
  bool local_59;
  int local_58;
  int local_54;
  int tmp_1;
  bool no_right_pawns;
  U64 right_pawns;
  int sq_1;
  int tmp;
  U64 left_pawns;
  int sq;
  bool right_greater;
  int iStack_24;
  bool left_greater;
  int right;
  int left;
  U64 *pawns_local;
  int *col_local;
  int *row_local;
  
  if (*col + -1 < 0) {
    local_54 = -1;
  }
  else {
    local_54 = *col + -1;
  }
  iStack_24 = local_54;
  if (*col + 1 < 8) {
    local_58 = *col + 1;
  }
  else {
    local_58 = -1;
  }
  sq = local_58;
  left_pawns._7_1_ = false;
  left_pawns._6_1_ = 0;
  _right = pawns;
  pawns_local = (U64 *)col;
  col_local = row;
  if (local_54 != -1) {
    left_pawns._0_4_ = -1;
    _sq_1 = (&bitboards::col)[local_54] & *pawns;
    while (_sq_1 != 0) {
      right_pawns._4_4_ = bits::pop_lsb((U64 *)&sq_1);
      if ((int)left_pawns < right_pawns._4_4_) {
        left_pawns._0_4_ = right_pawns._4_4_;
      }
    }
    local_59 = false;
    if (0 < (int)left_pawns) {
      iVar1 = util::row((int *)&left_pawns);
      local_59 = *col_local < iVar1;
    }
    left_pawns._7_1_ = local_59;
  }
  if (sq != -1) {
    right_pawns._0_4_ = -1;
    _tmp_1 = (&bitboards::col)[sq] & *_right;
    bVar2 = _tmp_1 == 0;
    while (_tmp_1 != 0) {
      iVar1 = bits::pop_lsb((U64 *)&tmp_1);
      if ((int)right_pawns < iVar1) {
        right_pawns._0_4_ = iVar1;
      }
    }
    if (0 < (int)right_pawns) {
      iVar1 = util::row((int *)&right_pawns);
      left_pawns._6_1_ = 1;
      if (*col_local < iVar1) goto LAB_00146af5;
    }
    left_pawns._6_1_ = bVar2;
  }
LAB_00146af5:
  if (((iStack_24 != -1) || (local_5b = 1, (left_pawns._6_1_ & 1) == 0)) &&
     ((sq != -1 || (local_5b = 1, (left_pawns._7_1_ & 1) == 0)))) {
    local_5c = 0;
    if ((left_pawns._7_1_ & 1) != 0) {
      local_5c = left_pawns._6_1_;
    }
    local_5b = local_5c;
  }
  return (bool)(local_5b & 1);
}

Assistant:

inline bool backward_pawn(const int& row, const int& col, const U64& pawns) {
	int left = col - 1 < Col::A ? -1 : col - 1;
	int right = col + 1 > Col::H ? -1 : col + 1;
	bool left_greater = false;
	bool right_greater = false;

	if (c == white) {
		if (left != -1) {
			int sq = -1;
			U64 left_pawns = bitboards::col[left] & pawns;
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp > sq) sq = tmp;
			}
			left_greater = sq > 0 && util::row(sq) > row;
		}

		if (right != -1) {
			int sq = -1;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp > sq) sq = tmp;
			}
			right_greater = sq > 0 && util::row(sq) > row || no_right_pawns;
		}
	}
	else {
		if (left != -1) {
			int sq = 100;
			U64 left_pawns = bitboards::col[left] & pawns;
			bool no_left_pawns = (left_pawns == 0ULL);
			while (left_pawns) {
				int tmp = bits::pop_lsb(left_pawns);
				if (tmp < sq) sq = tmp;
			}
			left_greater = sq < 100 && util::row(sq) < row || no_left_pawns;
		}
		if (right != -1) {
			int sq = 100;
			U64 right_pawns = bitboards::col[right] & pawns;
			bool no_right_pawns = (right_pawns == 0ULL);
			while (right_pawns) {
				int tmp = bits::pop_lsb(right_pawns);
				if (tmp < sq) sq = tmp;
			}
			right_greater = sq < 100 && util::row(sq) < row || no_right_pawns;
		}
	}

	return (left == -1 && right_greater) ||
		(right == -1 && left_greater) ||
		(left_greater && right_greater);
}